

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalMultiplyOverflowCheck,bool>
               (uint *ldata,uint *rdata,uint *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  InternalException *pIVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  ulong uVar10;
  sel_t *psVar11;
  idx_t idx_in_entry;
  ulong uVar12;
  unsigned_long local_70;
  string local_68;
  buffer_ptr<ValidityBuffer> *local_40;
  sel_t *local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_70 = 0x29;
      local_68._M_dataplus._M_p =
           (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
      local_68.field_2._M_allocated_capacity = local_70;
      builtin_strncpy(local_68._M_dataplus._M_p,"Unimplemented type for TryDecimalMultiply",0x29);
      local_68._M_string_length = local_70;
      local_68._M_dataplus._M_p[local_70] = '\0';
      InternalException::InternalException(pIVar7,&local_68);
      __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if (count != 0) {
    psVar2 = lsel->sel_vector;
    psVar11 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar12 = 0;
    local_38 = psVar11;
    do {
      uVar10 = uVar12;
      if (psVar2 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar2[uVar12];
      }
      uVar8 = uVar12;
      if (psVar11 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar11[uVar12];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) {
        puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
LAB_010cbe34:
          pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          local_70 = 0x29;
          local_68._M_dataplus._M_p =
               (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
          local_68.field_2._M_allocated_capacity = local_70;
          builtin_strncpy(local_68._M_dataplus._M_p,"Unimplemented type for TryDecimalMultiply",0x29
                         );
          local_68._M_string_length = local_70;
          local_68._M_dataplus._M_p[local_70] = '\0';
          InternalException::InternalException(pIVar7,&local_68);
          __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((puVar3[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) goto LAB_010cbe34;
      }
      if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
          (unsigned_long *)0x0) {
        local_70 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_68,&local_70);
        sVar6 = local_68._M_string_length;
        _Var5._M_p = local_68._M_dataplus._M_p;
        local_68._M_dataplus._M_p = (pointer)0x0;
        local_68._M_string_length = 0;
        this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
        (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)_Var5._M_p;
        (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
        }
        pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                           (local_40);
        (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
             (unsigned_long *)
             (pTVar9->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        psVar11 = local_38;
      }
      bVar4 = (byte)uVar12 & 0x3f;
      puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
               (uVar12 >> 6);
      *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}